

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O1

int __thiscall hwnet::util::TimerMgr::remove(TimerMgr *this,char *__filename)

{
  Timer *pTVar1;
  ulong uVar2;
  ulong uVar3;
  pointer ppTVar4;
  Timer *pTVar5;
  Timer *e;
  ulong uVar6;
  long lVar7;
  int iVar8;
  undefined8 unaff_R12;
  undefined7 uVar9;
  
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar8 == 0) {
    pTVar1 = *(Timer **)__filename;
    if (((pTVar1->mMgr == this) && (uVar2 = pTVar1->mIndex, uVar2 != 0)) &&
       (uVar3 = this->elements_size, uVar2 <= uVar3)) {
      ppTVar4 = (this->elements).
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar5 = ppTVar4[uVar2 - 1];
      uVar9 = (undefined7)((ulong)unaff_R12 >> 8);
      iVar8 = (int)CONCAT71(uVar9,pTVar5 == pTVar1);
      if (pTVar5 == pTVar1) {
        e = ppTVar4[uVar3 - 1];
        if (e == pTVar1) {
          this->elements_size = uVar3 - 1;
        }
        else {
          uVar6 = e->mIndex;
          if (uVar2 != uVar6) {
            ppTVar4[uVar2 - 1] = ppTVar4[uVar6 - 1];
            (this->elements).
            super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6 - 1] = pTVar5;
            ppTVar4 = (this->elements).
                      super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppTVar4[uVar2 - 1]->mIndex = uVar2;
            ppTVar4[uVar6 - 1]->mIndex = uVar6;
          }
          this->elements_size = uVar3 - 1;
          change(this,e);
        }
        (this->elements).
        super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
        super__Vector_impl_data._M_start[this->elements_size] = (Timer *)0x0;
        lVar7 = *(long *)__filename;
        *(undefined8 *)(lVar7 + 0x50) = 0;
        if (*(code **)(lVar7 + 0x20) != (code *)0x0) {
          (**(code **)(lVar7 + 0x20))(lVar7 + 0x10,lVar7 + 0x10,3);
          *(undefined8 *)(lVar7 + 0x20) = 0;
          *(undefined8 *)(lVar7 + 0x28) = 0;
        }
        lVar7 = *(long *)__filename;
        *(long *)(lVar7 + 0x68) = lVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar7 + 0x70),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(__filename + 8));
        iVar8 = (int)CONCAT71(uVar9,1);
      }
    }
    else {
      iVar8 = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return iVar8;
  }
  std::__throw_system_error(iVar8);
}

Assistant:

bool remove(Timer::Ptr &e) {
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this == e->mMgr) {
			if(e->mIndex == 0 || e->mIndex > this->elements_size) {
				return false;
			}

			auto offsetIdx = getOffset(e->mIndex);
			if(this->elements[offsetIdx] != e.get()) {
				return false;
			}

			auto tail = this->elements[this->elements_size-1];
			
			if(tail == e.get()) {
				this->elements_size--;
			} else {
				this->swap(e->mIndex,tail->mIndex);
				this->elements_size--;
				this->change(tail);
			}

			this->elements[this->elements_size] = nullptr;
			e->mIndex = 0;
			e->mCallback = nullptr;
			e->selfPtr = e;
			return true;
		} else {
			return false;
		} 
	}